

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::Matchers::StringMatcherBase::describe_abi_cxx11_
          (string *__return_storage_ptr__,StringMatcherBase *this)

{
  size_type sVar1;
  long lVar2;
  StringRef SVar3;
  StringRef rhs;
  string *local_68;
  char *local_60;
  StringRef local_30;
  undefined1 local_19;
  StringMatcherBase *local_18;
  StringMatcherBase *this_local;
  string *description;
  
  local_19 = 0;
  local_18 = this;
  this_local = (StringMatcherBase *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar1 = StringRef::size(&this->m_operation);
  lVar2 = std::__cxx11::string::size();
  sVar1 = sVar1 + lVar2;
  local_30 = CasedString::caseSensitivitySuffix(&this->m_comparator);
  StringRef::size(&local_30);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  SVar3.m_size = sVar1;
  SVar3.m_start = (char *)(this->m_operation).m_size;
  Catch::operator+=((Catch *)__return_storage_ptr__,(string *)(this->m_operation).m_start,SVar3);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": \"");
  std::__cxx11::string::operator+=
            ((string *)__return_storage_ptr__,(string *)&(this->m_comparator).m_str);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'\"');
  SVar3 = CasedString::caseSensitivitySuffix(&this->m_comparator);
  local_68 = (string *)SVar3.m_start;
  local_60 = (char *)SVar3.m_size;
  rhs.m_size = sVar1;
  rhs.m_start = local_60;
  Catch::operator+=((Catch *)__return_storage_ptr__,local_68,rhs);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMatcherBase::describe() const {
        std::string description;
        description.reserve(5 + m_operation.size() + m_comparator.m_str.size() +
                                    m_comparator.caseSensitivitySuffix().size());
        description += m_operation;
        description += ": \"";
        description += m_comparator.m_str;
        description += '"';
        description += m_comparator.caseSensitivitySuffix();
        return description;
    }